

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O1

char * GetOpName(SynUnaryOpType type)

{
  if (type - SYN_UNARY_OP_PLUS < 4) {
    return &DAT_00358e60 + *(int *)(&DAT_00358e60 + (ulong)(type - SYN_UNARY_OP_PLUS) * 4);
  }
  __assert_fail("!\"unknown operation type\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                ,0xe98,"const char *GetOpName(SynUnaryOpType)");
}

Assistant:

const char* GetOpName(SynUnaryOpType type)
{
	switch(type)
	{
	case SYN_UNARY_OP_PLUS:
		return "+";
	case SYN_UNARY_OP_NEGATE:
		return "-";
	case SYN_UNARY_OP_BIT_NOT:
		return "~";
	case SYN_UNARY_OP_LOGICAL_NOT:
		return "!";
	default:
		break;
	}

	assert(!"unknown operation type");
	return "";
}